

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int cast(BigArrayIter *dst,BigArrayIter *src,size_t nmemb)

{
  undefined8 uVar1;
  float *pfVar2;
  double *pdVar3;
  int iVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  float local_2ac;
  cplx64_t *p2_38;
  cplx128_t *p1_38;
  cplx128_t *p2_37;
  cplx64_t *p1_37;
  char *p2_36;
  float *p1_36;
  uint64_t *p2_35;
  float *p1_35;
  uint32_t *p2_34;
  float *p1_34;
  int64_t *p2_33;
  float *p1_33;
  int32_t *p2_32;
  float *p1_32;
  double *p2_31;
  float *p1_31;
  char *p2_30;
  uint32_t *p1_30;
  float *p2_29;
  uint32_t *p1_29;
  double *p2_28;
  uint32_t *p1_28;
  int64_t *p2_27;
  uint32_t *p1_27;
  int32_t *p2_26;
  uint32_t *p1_26;
  uint64_t *p2_25;
  uint32_t *p1_25;
  char *p2_24;
  int32_t *p1_24;
  float *p2_23;
  int32_t *p1_23;
  double *p2_22;
  int32_t *p1_22;
  uint64_t *p2_21;
  int32_t *p1_21;
  uint32_t *p2_20;
  int32_t *p1_20;
  int64_t *p2_19;
  int32_t *p1_19;
  char *p2_18;
  double *p1_18;
  uint64_t *p2_17;
  double *p1_17;
  uint32_t *p2_16;
  double *p1_16;
  int64_t *p2_15;
  double *p1_15;
  int32_t *p2_14;
  double *p1_14;
  float *p2_13;
  double *p1_13;
  char *p2_12;
  uint64_t *p1_12;
  float *p2_11;
  uint64_t *p1_11;
  double *p2_10;
  uint64_t *p1_10;
  int64_t *p2_9;
  uint64_t *p1_9;
  int32_t *p2_8;
  uint64_t *p1_8;
  uint32_t *p2_7;
  uint64_t *p1_7;
  char *p2_6;
  int64_t *p1_6;
  float *p2_5;
  int64_t *p1_5;
  double *p2_4;
  int64_t *p1_4;
  uint64_t *p2_3;
  int64_t *p1_3;
  uint32_t *p2_2;
  int64_t *p1_2;
  int32_t *p2_1;
  int64_t *p1_1;
  void *p2;
  void *p1;
  size_t elsize;
  ptrdiff_t i;
  size_t nmemb_local;
  BigArrayIter *src_local;
  BigArrayIter *dst_local;
  
  iVar4 = strcmp(dst->array->dtype + 1,src->array->dtype + 1);
  if (iVar4 == 0) {
    if ((dst->contiguous != 0) && (src->contiguous != 0)) {
      memcpy(dst->dataptr,src->dataptr,nmemb * dst->array->strides[dst->array->ndim + -1]);
      dst->dataptr = (void *)((long)dst->dataptr +
                             nmemb * dst->array->strides[dst->array->ndim + -1]);
      src->dataptr = (void *)((long)src->dataptr +
                             nmemb * src->array->strides[src->array->ndim + -1]);
      return 0;
    }
    iVar4 = big_file_dtype_itemsize(dst->array->dtype);
    for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
      memcpy(dst->dataptr,src->dataptr,(long)iVar4);
      big_array_iter_advance(dst);
      big_array_iter_advance(src);
    }
    return 0;
  }
  iVar4 = strcmp(dst->array->dtype + 1,"i8");
  if (iVar4 == 0) {
    iVar4 = strcmp("i8",dst->array->dtype + 1);
    if ((iVar4 == 0) && (iVar4 = strcmp("i4",src->array->dtype + 1), iVar4 == 0)) {
      for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
        *(long *)dst->dataptr = (long)*src->dataptr;
        big_array_iter_advance(dst);
        big_array_iter_advance(src);
      }
      return 0;
    }
    iVar4 = strcmp("i8",dst->array->dtype + 1);
    if ((iVar4 == 0) && (iVar4 = strcmp("u4",src->array->dtype + 1), iVar4 == 0)) {
      for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
        *(ulong *)dst->dataptr = (ulong)*src->dataptr;
        big_array_iter_advance(dst);
        big_array_iter_advance(src);
      }
      return 0;
    }
    iVar4 = strcmp("i8",dst->array->dtype + 1);
    if ((iVar4 == 0) && (iVar4 = strcmp("u8",src->array->dtype + 1), iVar4 == 0)) {
      for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
        *(undefined8 *)dst->dataptr = *src->dataptr;
        big_array_iter_advance(dst);
        big_array_iter_advance(src);
      }
      return 0;
    }
    iVar4 = strcmp("i8",dst->array->dtype + 1);
    if ((iVar4 == 0) && (iVar4 = strcmp("f8",src->array->dtype + 1), iVar4 == 0)) {
      for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
        *(long *)dst->dataptr = (long)*src->dataptr;
        big_array_iter_advance(dst);
        big_array_iter_advance(src);
      }
      return 0;
    }
    iVar4 = strcmp("i8",dst->array->dtype + 1);
    if ((iVar4 == 0) && (iVar4 = strcmp("f4",src->array->dtype + 1), iVar4 == 0)) {
      for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
        *(long *)dst->dataptr = (long)*src->dataptr;
        big_array_iter_advance(dst);
        big_array_iter_advance(src);
      }
      return 0;
    }
    iVar4 = strcmp("i8",dst->array->dtype + 1);
    if ((iVar4 == 0) && (iVar4 = strcmp("b1",src->array->dtype + 1), iVar4 == 0)) {
      for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
        *(long *)dst->dataptr = (long)*src->dataptr;
        big_array_iter_advance(dst);
        big_array_iter_advance(src);
      }
      return 0;
    }
  }
  else {
    iVar4 = strcmp(dst->array->dtype + 1,"u8");
    if (iVar4 == 0) {
      iVar4 = strcmp("u8",dst->array->dtype + 1);
      if ((iVar4 == 0) && (iVar4 = strcmp("u4",src->array->dtype + 1), iVar4 == 0)) {
        for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
          *(ulong *)dst->dataptr = (ulong)*src->dataptr;
          big_array_iter_advance(dst);
          big_array_iter_advance(src);
        }
        return 0;
      }
      iVar4 = strcmp("u8",dst->array->dtype + 1);
      if ((iVar4 == 0) && (iVar4 = strcmp("i4",src->array->dtype + 1), iVar4 == 0)) {
        for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
          *(long *)dst->dataptr = (long)*src->dataptr;
          big_array_iter_advance(dst);
          big_array_iter_advance(src);
        }
        return 0;
      }
      iVar4 = strcmp("u8",dst->array->dtype + 1);
      if ((iVar4 == 0) && (iVar4 = strcmp("i8",src->array->dtype + 1), iVar4 == 0)) {
        for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
          *(undefined8 *)dst->dataptr = *src->dataptr;
          big_array_iter_advance(dst);
          big_array_iter_advance(src);
        }
        return 0;
      }
      iVar4 = strcmp("u8",dst->array->dtype + 1);
      if ((iVar4 == 0) && (iVar4 = strcmp("f8",src->array->dtype + 1), iVar4 == 0)) {
        for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
          uVar5 = (ulong)*src->dataptr;
          *(ulong *)dst->dataptr =
               uVar5 | (long)(*src->dataptr - 9.223372036854776e+18) & (long)uVar5 >> 0x3f;
          big_array_iter_advance(dst);
          big_array_iter_advance(src);
        }
        return 0;
      }
      iVar4 = strcmp("u8",dst->array->dtype + 1);
      if ((iVar4 == 0) && (iVar4 = strcmp("f4",src->array->dtype + 1), iVar4 == 0)) {
        for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
          uVar5 = (ulong)*src->dataptr;
          *(ulong *)dst->dataptr =
               uVar5 | (long)(*src->dataptr - 9.223372e+18) & (long)uVar5 >> 0x3f;
          big_array_iter_advance(dst);
          big_array_iter_advance(src);
        }
        return 0;
      }
      iVar4 = strcmp("u8",dst->array->dtype + 1);
      if ((iVar4 == 0) && (iVar4 = strcmp("b1",src->array->dtype + 1), iVar4 == 0)) {
        for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
          *(long *)dst->dataptr = (long)*src->dataptr;
          big_array_iter_advance(dst);
          big_array_iter_advance(src);
        }
        return 0;
      }
    }
    else {
      iVar4 = strcmp(dst->array->dtype + 1,"f8");
      if (iVar4 == 0) {
        iVar4 = strcmp("f8",dst->array->dtype + 1);
        if ((iVar4 == 0) && (iVar4 = strcmp("f4",src->array->dtype + 1), iVar4 == 0)) {
          for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
            *(double *)dst->dataptr = (double)*src->dataptr;
            big_array_iter_advance(dst);
            big_array_iter_advance(src);
          }
          return 0;
        }
        iVar4 = strcmp("f8",dst->array->dtype + 1);
        if ((iVar4 == 0) && (iVar4 = strcmp("i4",src->array->dtype + 1), iVar4 == 0)) {
          for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
            *(double *)dst->dataptr = (double)*src->dataptr;
            big_array_iter_advance(dst);
            big_array_iter_advance(src);
          }
          return 0;
        }
        iVar4 = strcmp("f8",dst->array->dtype + 1);
        if ((iVar4 == 0) && (iVar4 = strcmp("i8",src->array->dtype + 1), iVar4 == 0)) {
          for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
            *(double *)dst->dataptr = (double)*src->dataptr;
            big_array_iter_advance(dst);
            big_array_iter_advance(src);
          }
          return 0;
        }
        iVar4 = strcmp("f8",dst->array->dtype + 1);
        if ((iVar4 == 0) && (iVar4 = strcmp("u4",src->array->dtype + 1), iVar4 == 0)) {
          for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
            *(double *)dst->dataptr = (double)*src->dataptr;
            big_array_iter_advance(dst);
            big_array_iter_advance(src);
          }
          return 0;
        }
        iVar4 = strcmp("f8",dst->array->dtype + 1);
        if ((iVar4 == 0) && (iVar4 = strcmp("u8",src->array->dtype + 1), iVar4 == 0)) {
          for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
            uVar1 = *src->dataptr;
            auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar6._0_8_ = uVar1;
            auVar6._12_4_ = 0x45300000;
            *(double *)dst->dataptr =
                 (auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
            big_array_iter_advance(dst);
            big_array_iter_advance(src);
          }
          return 0;
        }
        iVar4 = strcmp("f8",dst->array->dtype + 1);
        if ((iVar4 == 0) && (iVar4 = strcmp("b1",src->array->dtype + 1), iVar4 == 0)) {
          for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
            *(double *)dst->dataptr = (double)(int)*src->dataptr;
            big_array_iter_advance(dst);
            big_array_iter_advance(src);
          }
          return 0;
        }
      }
      else {
        iVar4 = strcmp(dst->array->dtype + 1,"i4");
        if (iVar4 == 0) {
          iVar4 = strcmp("i4",dst->array->dtype + 1);
          if ((iVar4 == 0) && (iVar4 = strcmp("i8",src->array->dtype + 1), iVar4 == 0)) {
            for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
              *(int *)dst->dataptr = (int)*src->dataptr;
              big_array_iter_advance(dst);
              big_array_iter_advance(src);
            }
            return 0;
          }
          iVar4 = strcmp("i4",dst->array->dtype + 1);
          if ((iVar4 == 0) && (iVar4 = strcmp("u4",src->array->dtype + 1), iVar4 == 0)) {
            for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
              *(undefined4 *)dst->dataptr = *src->dataptr;
              big_array_iter_advance(dst);
              big_array_iter_advance(src);
            }
            return 0;
          }
          iVar4 = strcmp("i4",dst->array->dtype + 1);
          if ((iVar4 == 0) && (iVar4 = strcmp("u8",src->array->dtype + 1), iVar4 == 0)) {
            for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
              *(int *)dst->dataptr = (int)*src->dataptr;
              big_array_iter_advance(dst);
              big_array_iter_advance(src);
            }
            return 0;
          }
          iVar4 = strcmp("i4",dst->array->dtype + 1);
          if ((iVar4 == 0) && (iVar4 = strcmp("f8",src->array->dtype + 1), iVar4 == 0)) {
            for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
              *(int *)dst->dataptr = (int)*src->dataptr;
              big_array_iter_advance(dst);
              big_array_iter_advance(src);
            }
            return 0;
          }
          iVar4 = strcmp("i4",dst->array->dtype + 1);
          if ((iVar4 == 0) && (iVar4 = strcmp("f4",src->array->dtype + 1), iVar4 == 0)) {
            for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
              *(int *)dst->dataptr = (int)*src->dataptr;
              big_array_iter_advance(dst);
              big_array_iter_advance(src);
            }
            return 0;
          }
          iVar4 = strcmp("i4",dst->array->dtype + 1);
          if ((iVar4 == 0) && (iVar4 = strcmp("b1",src->array->dtype + 1), iVar4 == 0)) {
            for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
              *(int *)dst->dataptr = (int)*src->dataptr;
              big_array_iter_advance(dst);
              big_array_iter_advance(src);
            }
            return 0;
          }
        }
        else {
          iVar4 = strcmp(dst->array->dtype + 1,"u4");
          if (iVar4 == 0) {
            iVar4 = strcmp("u4",dst->array->dtype + 1);
            if ((iVar4 == 0) && (iVar4 = strcmp("u8",src->array->dtype + 1), iVar4 == 0)) {
              for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                *(int *)dst->dataptr = (int)*src->dataptr;
                big_array_iter_advance(dst);
                big_array_iter_advance(src);
              }
              return 0;
            }
            iVar4 = strcmp("u4",dst->array->dtype + 1);
            if ((iVar4 == 0) && (iVar4 = strcmp("i4",src->array->dtype + 1), iVar4 == 0)) {
              for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                *(undefined4 *)dst->dataptr = *src->dataptr;
                big_array_iter_advance(dst);
                big_array_iter_advance(src);
              }
              return 0;
            }
            iVar4 = strcmp("u4",dst->array->dtype + 1);
            if ((iVar4 == 0) && (iVar4 = strcmp("i8",src->array->dtype + 1), iVar4 == 0)) {
              for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                *(int *)dst->dataptr = (int)*src->dataptr;
                big_array_iter_advance(dst);
                big_array_iter_advance(src);
              }
              return 0;
            }
            iVar4 = strcmp("u4",dst->array->dtype + 1);
            if ((iVar4 == 0) && (iVar4 = strcmp("f8",src->array->dtype + 1), iVar4 == 0)) {
              for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                *(int *)dst->dataptr = (int)(long)*src->dataptr;
                big_array_iter_advance(dst);
                big_array_iter_advance(src);
              }
              return 0;
            }
            iVar4 = strcmp("u4",dst->array->dtype + 1);
            if ((iVar4 == 0) && (iVar4 = strcmp("f4",src->array->dtype + 1), iVar4 == 0)) {
              for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                *(int *)dst->dataptr = (int)(long)*src->dataptr;
                big_array_iter_advance(dst);
                big_array_iter_advance(src);
              }
              return 0;
            }
            iVar4 = strcmp("u4",dst->array->dtype + 1);
            if ((iVar4 == 0) && (iVar4 = strcmp("b1",src->array->dtype + 1), iVar4 == 0)) {
              for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                *(int *)dst->dataptr = (int)*src->dataptr;
                big_array_iter_advance(dst);
                big_array_iter_advance(src);
              }
              return 0;
            }
          }
          else {
            iVar4 = strcmp(dst->array->dtype + 1,"f4");
            if (iVar4 == 0) {
              iVar4 = strcmp("f4",dst->array->dtype + 1);
              if ((iVar4 == 0) && (iVar4 = strcmp("f8",src->array->dtype + 1), iVar4 == 0)) {
                for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                  *(float *)dst->dataptr = (float)*src->dataptr;
                  big_array_iter_advance(dst);
                  big_array_iter_advance(src);
                }
                return 0;
              }
              iVar4 = strcmp("f4",dst->array->dtype + 1);
              if ((iVar4 == 0) && (iVar4 = strcmp("i4",src->array->dtype + 1), iVar4 == 0)) {
                for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                  *(float *)dst->dataptr = (float)*src->dataptr;
                  big_array_iter_advance(dst);
                  big_array_iter_advance(src);
                }
                return 0;
              }
              iVar4 = strcmp("f4",dst->array->dtype + 1);
              if ((iVar4 == 0) && (iVar4 = strcmp("i8",src->array->dtype + 1), iVar4 == 0)) {
                for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                  *(float *)dst->dataptr = (float)*src->dataptr;
                  big_array_iter_advance(dst);
                  big_array_iter_advance(src);
                }
                return 0;
              }
              iVar4 = strcmp("f4",dst->array->dtype + 1);
              if ((iVar4 == 0) && (iVar4 = strcmp("u4",src->array->dtype + 1), iVar4 == 0)) {
                for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                  *(float *)dst->dataptr = (float)*src->dataptr;
                  big_array_iter_advance(dst);
                  big_array_iter_advance(src);
                }
                return 0;
              }
              iVar4 = strcmp("f4",dst->array->dtype + 1);
              if ((iVar4 == 0) && (iVar4 = strcmp("u8",src->array->dtype + 1), iVar4 == 0)) {
                for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                  local_2ac = (float)*src->dataptr;
                  *(float *)dst->dataptr = local_2ac;
                  big_array_iter_advance(dst);
                  big_array_iter_advance(src);
                }
                return 0;
              }
              iVar4 = strcmp("f4",dst->array->dtype + 1);
              if ((iVar4 == 0) && (iVar4 = strcmp("b1",src->array->dtype + 1), iVar4 == 0)) {
                for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                  *(float *)dst->dataptr = (float)(int)*src->dataptr;
                  big_array_iter_advance(dst);
                  big_array_iter_advance(src);
                }
                return 0;
              }
            }
            else {
              iVar4 = strcmp(dst->array->dtype + 1,"c8");
              if (iVar4 == 0) {
                iVar4 = strcmp("c8",dst->array->dtype + 1);
                if ((iVar4 == 0) && (iVar4 = strcmp("c16",src->array->dtype + 1), iVar4 == 0)) {
                  for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                    pfVar2 = (float *)dst->dataptr;
                    pdVar3 = (double *)src->dataptr;
                    *pfVar2 = (float)*pdVar3;
                    pfVar2[1] = (float)pdVar3[1];
                    big_array_iter_advance(dst);
                    big_array_iter_advance(src);
                  }
                  return 0;
                }
              }
              else {
                iVar4 = strcmp(dst->array->dtype + 1,"c16");
                if (((iVar4 == 0) && (iVar4 = strcmp("c16",dst->array->dtype + 1), iVar4 == 0)) &&
                   (iVar4 = strcmp("c8",src->array->dtype + 1), iVar4 == 0)) {
                  for (elsize = 0; elsize < nmemb; elsize = elsize + 1) {
                    pdVar3 = (double *)dst->dataptr;
                    pfVar2 = (float *)src->dataptr;
                    *pdVar3 = (double)*pfVar2;
                    pdVar3[1] = (double)pfVar2[1];
                    big_array_iter_advance(dst);
                    big_array_iter_advance(src);
                  }
                  return 0;
                }
              }
            }
          }
        }
      }
    }
  }
  _big_file_raise("Unsupported conversion from %s to %s. ",
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                  ,0x587,src->array->dtype,dst->array->dtype);
  return -1;
}

Assistant:

static int
cast(BigArrayIter * dst, BigArrayIter * src, size_t nmemb)
{
    /* doing cast assuming native byte order */
    /* convert buf2 to buf1, both are native;
     * dtype has no endian-ness prefix
     *   */
    ptrdiff_t i;
    /* same type, no need for casting. */
    if (0 == strcmp(dst->array->dtype + 1, src->array->dtype + 1)) {
        if(dst->contiguous && src->contiguous) {
            /* directly copy of memory chunks; FIXME: use memmove? */
            memcpy(dst->dataptr, src->dataptr, nmemb * dst->array->strides[dst->array->ndim-1]);
            dst->dataptr = (char*) dst->dataptr + nmemb * dst->array->strides[dst->array->ndim - 1];
            src->dataptr = (char*) src->dataptr + nmemb * src->array->strides[src->array->ndim - 1];
            return 0;
        } else {
            /* copy one by one, discontinuous */
            size_t elsize = big_file_dtype_itemsize(dst->array->dtype);
            for(i = 0; i < nmemb; i ++) {
                void * p1 = dst->dataptr;
                void * p2 = src->dataptr;
                memcpy(p1, p2, elsize);
                big_array_iter_advance(dst); big_array_iter_advance(src);
            }
            return 0;
        }
    }
    if(0 == strcmp(dst->array->dtype + 1, "i8")) {
        CAST("i8", int64_t, "i4", int32_t);
        CAST("i8", int64_t, "u4", uint32_t);
        CAST("i8", int64_t, "u8", uint64_t);
        CAST("i8", int64_t, "f8", double);
        CAST("i8", int64_t, "f4", float);
        CAST("i8", int64_t, "b1", char);
    } else
    if(0 == strcmp(dst->array->dtype + 1, "u8")) {
        CAST("u8", uint64_t, "u4", uint32_t);
        CAST("u8", uint64_t, "i4", int32_t);
        CAST("u8", uint64_t, "i8", int64_t);
        CAST("u8", uint64_t, "f8", double);
        CAST("u8", uint64_t, "f4", float);
        CAST("u8", uint64_t, "b1", char);
    } else
    if(0 == strcmp(dst->array->dtype + 1, "f8")) {
        CAST("f8", double, "f4", float);
        CAST("f8", double, "i4", int32_t);
        CAST("f8", double, "i8", int64_t);
        CAST("f8", double, "u4", uint32_t);
        CAST("f8", double, "u8", uint64_t);
        CAST("f8", double, "b1", char);
    } else
    if(0 == strcmp(dst->array->dtype + 1, "i4")) {
        CAST("i4", int32_t, "i8", int64_t);
        CAST("i4", int32_t, "u4", uint32_t);
        CAST("i4", int32_t, "u8", uint64_t);
        CAST("i4", int32_t, "f8", double);
        CAST("i4", int32_t, "f4", float);
        CAST("i4", int32_t, "b1", char);
    } else
    if(0 == strcmp(dst->array->dtype + 1, "u4")) {
        CAST("u4", uint32_t, "u8", uint64_t);
        CAST("u4", uint32_t, "i4", int32_t);
        CAST("u4", uint32_t, "i8", int64_t);
        CAST("u4", uint32_t, "f8", double);
        CAST("u4", uint32_t, "f4", float);
        CAST("u4", uint32_t, "b1", char);
    } else
    if(0 == strcmp(dst->array->dtype + 1, "f4")) {
        CAST("f4", float, "f8", double);
        CAST("f4", float, "i4", int32_t);
        CAST("f4", float, "i8", int64_t);
        CAST("f4", float, "u4", uint32_t);
        CAST("f4", float, "u8", uint64_t);
        CAST("f4", float, "b1", char);
    } else
    if(0 == strcmp(dst->array->dtype + 1, "c8")) {
        CAST2("c8", cplx64_t, "c16", cplx128_t);
    } else
    if(0 == strcmp(dst->array->dtype + 1, "c16")) {
        CAST2("c16", cplx128_t, "c8", cplx64_t);
    }
    RAISE(ex, "Unsupported conversion from %s to %s. ", src->array->dtype, dst->array->dtype);
ex:
    return -1;
}